

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRead.c
# Opt level: O1

char * Amap_LoadFile(char *pFileName)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  char *__s;
  size_t sVar3;
  
  __stream = (FILE *)Io_FileOpen(pFileName,"open_path","rb",1);
  if (__stream == (FILE *)0x0) {
    __s = (char *)0x0;
    printf("Cannot open file \"%s\".\n",pFileName);
  }
  else {
    fseek(__stream,0,2);
    lVar2 = ftell(__stream);
    rewind(__stream);
    iVar1 = (int)lVar2;
    __s = (char *)malloc((long)(iVar1 + 10));
    fread(__s,(long)iVar1,1,__stream);
    __s[iVar1] = '\0';
    sVar3 = strlen(__s);
    builtin_strncpy(__s + sVar3,"\n.end\n",7);
    fclose(__stream);
  }
  return __s;
}

Assistant:

char * Amap_LoadFile( char * pFileName )
{
//    extern FILE * Io_FileOpen( const char * FileName, const char * PathVar, const char * Mode, int fVerbose );
    FILE * pFile;
    char * pBuffer;
    int nFileSize;
    int RetValue;
    // open the BLIF file for binary reading
    pFile = Io_FileOpen( pFileName, "open_path", "rb", 1 );
//    pFile = fopen( FileName, "rb" );
    // if we got this far, file should be okay otherwise would
    // have been detected by caller
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\".\n", pFileName );
        return NULL;
    }
    assert ( pFile != NULL );
    // get the file size, in bytes
    fseek( pFile, 0, SEEK_END );  
    nFileSize = ftell( pFile );  
    // move the file current reading position to the beginning
    rewind( pFile ); 
    // load the contents of the file into memory
    pBuffer = ABC_ALLOC( char, nFileSize + 10 );
    RetValue = fread( pBuffer, nFileSize, 1, pFile );
    // terminate the string with '\0'
    pBuffer[ nFileSize ] = '\0';
    strcat( pBuffer, "\n.end\n" );
    // close file
    fclose( pFile );
    return pBuffer;
}